

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotTesting.c
# Opt level: O2

void printGuardList(UnitList *guardList)

{
  UnitNode *pUVar1;
  int i;
  int iVar2;
  char *pcVar3;
  
  pUVar1 = getHead(guardList);
  pcVar3 = (char *)pUVar1->unit;
  printf("\nGuard List Size: %d\n",(ulong)(uint)guardList->count);
  puts("\n\n#### PRINTING GUARDS ####\n");
  for (iVar2 = 0; iVar2 < guardList->count + -1; iVar2 = iVar2 + 1) {
    printf("Guard Type : %c\n",(ulong)(uint)(int)*pcVar3);
    printf("Location: %d\n",(ulong)*(uint *)(pcVar3 + 4));
    printf("Damage: %d\n",(ulong)*(uint *)(pcVar3 + 8));
    printf("Range: %d\n",(ulong)*(uint *)(pcVar3 + 0xc));
    printf("Cool Down: %d\n",(ulong)*(uint *)(pcVar3 + 0x10));
    putchar(10);
    pUVar1 = pUVar1->next;
    pcVar3 = (char *)pUVar1->unit;
  }
  puts("\n########################");
  return;
}

Assistant:

void printGuardList(struct UnitList *guardList) {
    struct UnitNode *nextNode;
    struct Guard *guard;

    nextNode = getHead(guardList);
    guard = (struct Guard *) nextNode->unit;
    printf("\nGuard List Size: %d\n", guardList->count);
    printf("\n\n#### PRINTING GUARDS ####\n\n");
    for (int i = 0; i < guardList->count - 1; i++) {
        printf("Guard Type : %c\n", guard->type);
        printf("Location: %d\n", guard->position);
        printf("Damage: %d\n", guard->damage);
        printf("Range: %d\n", guard->range);
        printf("Cool Down: %d\n", guard->cooldown);
        printf("\n");
        nextNode = nextNode->next;
        guard = (struct Guard *) nextNode->unit;
    }
    printf("\n########################\n");
}